

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

SparseTextureFormatInfo * __thiscall
Diligent::RenderDeviceGLImpl::GetSparseTextureFormatInfo
          (SparseTextureFormatInfo *__return_storage_ptr__,RenderDeviceGLImpl *this,
          TEXTURE_FORMAT TexFormat,RESOURCE_DIMENSION Dimension,Uint32 SampleCount)

{
  Char *Message;
  Uint32 *local_68;
  undefined1 local_38 [8];
  string msg;
  Uint32 SampleCount_local;
  RESOURCE_DIMENSION Dimension_local;
  TEXTURE_FORMAT TexFormat_local;
  RenderDeviceGLImpl *this_local;
  
  msg.field_2._8_4_ = SampleCount;
  msg.field_2._M_local_buf[0xd] = Dimension;
  msg.field_2._14_2_ = TexFormat;
  FormatString<char[54]>
            ((string *)local_38,
             (char (*) [54])"GetSparseTextureFormatInfo is not supported in OpenGL");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"GetSparseTextureFormatInfo",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x296);
  std::__cxx11::string::~string((string *)local_38);
  __return_storage_ptr__->BindFlags = BIND_NONE;
  local_68 = __return_storage_ptr__->TileSize;
  do {
    *local_68 = 0;
    local_68 = local_68 + 1;
  } while ((SPARSE_TEXTURE_FLAGS *)local_68 != &__return_storage_ptr__->Flags);
  __return_storage_ptr__->Flags = SPARSE_TEXTURE_FLAG_NONE;
  return __return_storage_ptr__;
}

Assistant:

SparseTextureFormatInfo RenderDeviceGLImpl::GetSparseTextureFormatInfo(TEXTURE_FORMAT     TexFormat,
                                                                       RESOURCE_DIMENSION Dimension,
                                                                       Uint32             SampleCount) const
{
    UNSUPPORTED("GetSparseTextureFormatInfo is not supported in OpenGL");
    return {};
}